

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

void __thiscall QPainter::setBrush(QPainter *this,QColor color)

{
  uint *puVar1;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var2;
  QColor color_00;
  bool bVar3;
  long in_FS_OFFSET;
  QColor local_38;
  undefined4 uStack_28;
  undefined4 local_24;
  char *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if ((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
      *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
       &((_Var2._M_head_impl)->engine)._M_t ==
      (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) {
    local_38.cspec = Hsv;
    local_24 = 0;
    local_38.ct._0_4_ = 0;
    local_38.ct._4_4_ = 0;
    local_38._12_4_ = 0;
    uStack_28 = 0;
    local_20 = "default";
    QMessageLogger::warning((char *)&local_38,"QPainter::setBrush: Painter not active");
  }
  else {
    local_38.cspec = 0xaaaaaaaa;
    local_38.ct._0_4_ = 0xaaaaaaaa;
    local_38.ct._4_4_ = 0xaaaaaaaa;
    local_38._12_4_ = 0xaaaaaaaa;
    if (color.cspec == Invalid) {
      QColor::QColor(&local_38,black);
    }
    else {
      local_38.ct._0_4_ = color.ct._0_4_;
      local_38.ct._4_4_ = color.ct._4_4_;
      local_38._12_4_ = color._12_4_;
      local_38.cspec = color.cspec;
    }
    bVar3 = ::operator==((QBrush *)((long)((_Var2._M_head_impl)->state)._M_t + 0x48),&local_38);
    if (!bVar3) {
      color_00.ct._0_4_ = local_38.ct._0_4_;
      color_00.cspec = local_38.cspec;
      color_00.ct._4_4_ = local_38.ct._4_4_;
      color_00._12_4_ = local_38._12_4_;
      QBrush::operator=((QBrush *)((long)((_Var2._M_head_impl)->state)._M_t + 0x48),color_00);
      if ((_Var2._M_head_impl)->extended == (QPaintEngineEx *)0x0) {
        puVar1 = (uint *)((long)((_Var2._M_head_impl)->state)._M_t + 8);
        *puVar1 = *puVar1 | 2;
      }
      else {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->extended->super_QPaintEngine + 0x110))();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::setBrush(QColor color)
{
    Q_D(QPainter);
    if (!d->engine) {
        qWarning("QPainter::setBrush: Painter not active");
        return;
    }

    const QColor actualColor = color.isValid() ? color : QColor(Qt::black);
    if (d->state->brush == actualColor)
        return;
    d->state->brush = actualColor;
    if (d->extended)
        d->extended->brushChanged();
    else
        d->state->dirtyFlags |= QPaintEngine::DirtyBrush;
}